

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O0

void sf_unescape(sf_vec *dest,sf_vec *src)

{
  void *pvVar1;
  size_t __n;
  undefined1 *puVar2;
  long *in_RSI;
  long *in_RDI;
  size_t slen;
  size_t len;
  uint8_t *o;
  uint8_t *q;
  uint8_t *p;
  size_t local_30;
  undefined1 *local_28;
  void *local_18;
  
  if (in_RSI[1] == 0) {
    *in_RDI = *in_RSI;
    in_RDI[1] = in_RSI[1];
  }
  else {
    local_28 = (undefined1 *)*in_RDI;
    local_18 = (void *)*in_RSI;
    local_30 = in_RSI[1];
    while( true ) {
      pvVar1 = memchr(local_18,0x5c,local_30);
      if (pvVar1 == (void *)0x0) break;
      __n = (long)pvVar1 - (long)local_18;
      memcpy(local_28,local_18,__n);
      puVar2 = local_28 + __n;
      local_18 = (void *)((long)pvVar1 + 2);
      local_28 = puVar2 + 1;
      *puVar2 = *(undefined1 *)((long)pvVar1 + 1);
      local_30 = local_30 - (__n + 2);
    }
    if (local_30 == in_RSI[1]) {
      *in_RDI = *in_RSI;
      in_RDI[1] = in_RSI[1];
    }
    else {
      memcpy(local_28,local_18,local_30);
      in_RDI[1] = (long)(local_28 + (local_30 - *in_RDI));
    }
  }
  return;
}

Assistant:

void sf_unescape(sf_vec *dest, const sf_vec *src) {
  const uint8_t *p, *q;
  uint8_t *o;
  size_t len, slen;

  if (src->len == 0) {
    *dest = *src;

    return;
  }

  o = dest->base;
  p = src->base;
  len = src->len;

  for (;;) {
    q = memchr(p, '\\', len);
    if (q == NULL) {
      if (len == src->len) {
        *dest = *src;

        return;
      }

      memcpy(o, p, len);
      o += len;

      break;
    }

    slen = (size_t)(q - p);
    memcpy(o, p, slen);
    o += slen;

    p = q + 1;
    *o++ = *p++;
    len -= slen + 2;
  }

  dest->len = (size_t)(o - dest->base);
}